

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioSetAlertFuncEx(uint gpio,gpioAlertFuncEx_t f,void *userdata)

{
  FILE *pFVar1;
  int iVar2;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: gpio=%d function=%08X userdata=%08X\n",myTimeStamp::buf,
            "gpioSetAlertFuncEx",gpio,(ulong)f & 0xffffffff,(int)userdata);
  }
  pFVar1 = _stderr;
  if (libInitialised == '\0') {
    iVar2 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
              "gpioSetAlertFuncEx");
    }
  }
  else if (gpio < 0x20) {
    intGpioSetAlertFunc(gpio,f,1,userdata);
    iVar2 = 0;
  }
  else {
    iVar2 = -2;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar1,"%s %s: bad gpio (%d)\n",myTimeStamp::buf,"gpioSetAlertFuncEx",gpio);
    }
  }
  return iVar2;
}

Assistant:

int gpioSetAlertFuncEx(unsigned gpio, gpioAlertFuncEx_t f, void *userdata)
{
   DBG(DBG_USER, "gpio=%d function=%08X userdata=%08X",
      gpio, (uint32_t)f, (uint32_t)userdata);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   intGpioSetAlertFunc(gpio, f, 1, userdata);

   return 0;
}